

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlSearchNsSafe(xmlNodePtr node,xmlChar *prefix,xmlNsPtr *out)

{
  _xmlNode **pp_Var1;
  _xmlDoc *p_Var2;
  int iVar3;
  xmlNsPtr pxVar4;
  _xmlNode *p_Var5;
  xmlNodePtr orig;
  _xmlNode *p_Var6;
  
  if (out == (xmlNsPtr *)0x0) {
    return 1;
  }
  *out = (xmlNsPtr)0x0;
  if (node == (xmlNodePtr)0x0) {
    return 1;
  }
  if (node->type == XML_NAMESPACE_DECL) {
    return 1;
  }
  p_Var2 = node->doc;
  p_Var6 = node;
  if ((((prefix == (xmlChar *)0x0 || p_Var2 == (_xmlDoc *)0x0) || (*prefix != 'x')) ||
      (prefix[1] != 'm')) || ((prefix[2] != 'l' || (prefix[3] != '\0')))) {
    while (p_Var5 = p_Var6, p_Var6->type != XML_ELEMENT_NODE) {
      p_Var6 = p_Var6->parent;
      if (p_Var6 == (_xmlNode *)0x0) {
        return 0;
      }
    }
    do {
      if (p_Var5->type != XML_ELEMENT_NODE) break;
      for (pxVar4 = p_Var5->nsDef; pxVar4 != (xmlNsPtr)0x0; pxVar4 = pxVar4->next) {
        iVar3 = xmlStrEqual(pxVar4->prefix,prefix);
        if ((iVar3 != 0) && (pxVar4->href != (xmlChar *)0x0)) goto LAB_0014cc72;
      }
      if ((((p_Var5 != node) && (pxVar4 = p_Var5->ns, pxVar4 != (xmlNsPtr)0x0)) &&
          (iVar3 = xmlStrEqual(pxVar4->prefix,prefix), iVar3 != 0)) &&
         (pxVar4->href != (xmlChar *)0x0)) goto LAB_0014cc72;
      pp_Var1 = &p_Var5->parent;
      p_Var5 = *pp_Var1;
    } while (*pp_Var1 != (_xmlNode *)0x0);
    if (p_Var2 != (_xmlDoc *)0x0 || prefix == (xmlChar *)0x0) {
      return 0;
    }
    if (*prefix != 'x') {
      return 0;
    }
    if (prefix[1] != 'm') {
      return 0;
    }
    if (prefix[2] != 'l') {
      return 0;
    }
    if (prefix[3] != '\0') {
      return 0;
    }
    pxVar4 = xmlNewXmlNs();
    if (pxVar4 == (xmlNsPtr)0x0) {
      return -1;
    }
    pxVar4->next = p_Var6->nsDef;
    p_Var6->nsDef = pxVar4;
  }
  else {
    pxVar4 = p_Var2->oldNs;
    if (pxVar4 == (xmlNsPtr)0x0) {
      pxVar4 = xmlNewXmlNs();
      p_Var2->oldNs = pxVar4;
    }
    if (pxVar4 == (xmlNsPtr)0x0) {
      return -1;
    }
  }
LAB_0014cc72:
  *out = pxVar4;
  return 0;
}

Assistant:

int
xmlSearchNsSafe(xmlNodePtr node, const xmlChar *prefix,
                xmlNsPtr *out) {
    xmlNsPtr cur;
    xmlDocPtr doc;
    xmlNodePtr orig = node;
    xmlNodePtr parent;

    if (out == NULL)
        return(1);
    *out = NULL;
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(1);

    doc = node->doc;

    if ((doc != NULL) && (IS_STR_XML(prefix))) {
        cur = xmlTreeEnsureXMLDecl(doc);
        if (cur == NULL)
            return(-1);
        *out = cur;
        return(0);
    }

    while (node->type != XML_ELEMENT_NODE) {
        node = node->parent;
        if (node == NULL)
            return(0);
    }

    parent = node;

    while ((node != NULL) && (node->type == XML_ELEMENT_NODE)) {
        cur = node->nsDef;
        while (cur != NULL) {
            if ((xmlStrEqual(cur->prefix, prefix)) &&
                (cur->href != NULL)) {
                *out = cur;
                return(0);
            }
            cur = cur->next;
        }
        if (orig != node) {
            cur = node->ns;
            if ((cur != NULL) &&
                (xmlStrEqual(cur->prefix, prefix)) &&
                (cur->href != NULL)) {
                *out = cur;
                return(0);
            }
        }

	node = node->parent;
    }

    /*
     * The XML-1.0 namespace is normally held on the document
     * element. In this case exceptionally create it on the
     * node element.
     */
    if ((doc == NULL) && (IS_STR_XML(prefix))) {
        cur = xmlNewXmlNs();
        if (cur == NULL)
            return(-1);
        cur->next = parent->nsDef;
        parent->nsDef = cur;
        *out = cur;
    }

    return(0);
}